

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void random_scalar_order(secp256k1_scalar *num)

{
  int iVar1;
  int overflow;
  uchar b32 [32];
  int local_3c;
  uchar local_38 [32];
  
  do {
    do {
      local_3c = 0;
      secp256k1_testrand256(local_38);
      secp256k1_scalar_set_b32(num,local_38,&local_3c);
    } while (local_3c != 0);
    iVar1 = secp256k1_scalar_is_zero(num);
  } while (iVar1 != 0);
  return;
}

Assistant:

static void random_scalar_order(secp256k1_scalar *num) {
    do {
        unsigned char b32[32];
        int overflow = 0;
        secp256k1_testrand256(b32);
        secp256k1_scalar_set_b32(num, b32, &overflow);
        if (overflow || secp256k1_scalar_is_zero(num)) {
            continue;
        }
        break;
    } while(1);
}